

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O2

float __thiscall
deqp::gles3::Functional::Vertex2DTextureCase::calculateLod
          (Vertex2DTextureCase *this,Vec2 *texScale,Vec2 *dstSize,int textureNdx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  Vec2 sizeRatio;
  Vector<float,_2> local_30;
  Vector<float,_2> local_28;
  float local_20;
  float local_1c;
  
  uVar1 = (this->m_textures[textureNdx]->m_refTexture).m_width;
  uVar2 = (this->m_textures[textureNdx]->m_refTexture).m_height;
  local_30.m_data[0] = (float)(int)uVar1;
  local_30.m_data[1] = (float)(int)uVar2;
  tcu::operator*(texScale,&local_30);
  tcu::operator/(&local_28,dstSize);
  fVar3 = deFloatLog2((float)(~-(uint)(local_1c <= local_20) & (uint)local_1c |
                             (uint)local_20 & -(uint)(local_1c <= local_20)));
  return fVar3;
}

Assistant:

float Vertex2DTextureCase::calculateLod (const Vec2& texScale, const Vec2& dstSize, int textureNdx) const
{
	const tcu::Texture2D&		refTexture	= m_textures[textureNdx]->getRefTexture();
	const Vec2					srcSize		= Vec2((float)refTexture.getWidth(), (float)refTexture.getHeight());
	const Vec2					sizeRatio	= texScale*srcSize / dstSize;

	// \note In this particular case dv/dx and du/dy are zero, simplifying the expression.
	return deFloatLog2(de::max(sizeRatio.x(), sizeRatio.y()));
}